

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftzopen.c
# Opt level: O0

void ft_lzwstate_done(FT_LzwState state)

{
  FT_Memory memory_00;
  FT_Memory memory;
  FT_LzwState state_local;
  
  memory_00 = state->memory;
  ft_lzwstate_reset(state);
  if (state->stack != state->stack_0) {
    ft_mem_free(memory_00,state->stack);
    state->stack = (FT_Byte *)0x0;
  }
  ft_mem_free(memory_00,state->prefix);
  state->prefix = (FT_UShort *)0x0;
  state->suffix = (FT_Byte *)0x0;
  memset(state,0,0xd8);
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  ft_lzwstate_done( FT_LzwState  state )
  {
    FT_Memory  memory = state->memory;


    ft_lzwstate_reset( state );

    if ( state->stack != state->stack_0 )
      FT_FREE( state->stack );

    FT_FREE( state->prefix );
    state->suffix = NULL;

    FT_ZERO( state );
  }